

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Performance::TextureUploadAndDrawCase::iterate(TextureUploadAndDrawCase *this)

{
  TheilSenCalibrator *pTVar1;
  State SVar2;
  deUint32 err;
  deUint64 dVar3;
  undefined4 extraout_var;
  IterateResult IVar4;
  int iVar5;
  
  IVar4 = STOP;
  if (((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
      m_testResult != QP_TEST_RESULT_NOT_SUPPORTED) {
    if (this->m_lastIterationRender == true) {
      pTVar1 = &(this->super_TextureUploadCase).m_calibrator;
      SVar2 = deqp::gls::TheilSenCalibrator::getState(pTVar1);
      if (SVar2 == STATE_MEASURE) {
        dVar3 = deGetMicroseconds();
        deqp::gls::TheilSenCalibrator::recordIteration(pTVar1,dVar3 - this->m_renderStart);
      }
    }
    pTVar1 = &(this->super_TextureUploadCase).m_calibrator;
    SVar2 = deqp::gls::TheilSenCalibrator::getState(pTVar1);
    if (SVar2 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(pTVar1);
      this->m_lastIterationRender = false;
      IVar4 = CONTINUE;
    }
    else if (SVar2 == STATE_MEASURE) {
      iVar5 = (this->super_TextureUploadCase).m_calibrator.m_measureState.numDrawCalls;
      dVar3 = deGetMicroseconds();
      this->m_renderStart = dVar3;
      this->m_lastIterationRender = true;
      IVar4 = CONTINUE;
      if (0 < iVar5) {
        do {
          render(this);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
    else {
      iVar5 = (*((this->super_TextureUploadCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
      glu::checkError(err,"finish",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                      ,0x1d0);
      TextureUploadCase::logResults(&this->super_TextureUploadCase);
      IVar4 = STOP;
    }
  }
  return IVar4;
}

Assistant:

tcu::TestNode::IterateResult TextureUploadAndDrawCase::iterate (void)
{
	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	if (m_lastIterationRender && (m_calibrator.getState() == gls::TheilSenCalibrator::STATE_MEASURE))
	{
		deUint64 curTime = deGetMicroseconds();
		m_calibrator.recordIteration(curTime - m_renderStart);
	}

	gls::TheilSenCalibrator::State state = m_calibrator.getState();

	if (state == gls::TheilSenCalibrator::STATE_MEASURE)
	{
		// Render
		int	numCalls = m_calibrator.getCallCount();

		m_renderStart			= deGetMicroseconds();
		m_lastIterationRender	= true;

		for (int i = 0; i < numCalls; i++)
			render();

		return CONTINUE;
	}
	else if (state == gls::TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
	{
		m_calibrator.recomputeParameters();
		m_lastIterationRender = false;
		return CONTINUE;
	}
	else
	{
		DE_ASSERT(state == gls::TheilSenCalibrator::STATE_FINISHED);
		GLU_EXPECT_NO_ERROR(m_context.getRenderContext().getFunctions().getError(), "finish");
		logResults();
		return STOP;
	}
}